

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeFinalizing.cpp
# Opt level: O0

Pass * wasm::createTypeFinalizingPass(void)

{
  TypeFinalizing *this;
  
  this = (TypeFinalizing *)operator_new(0x98);
  anon_unknown_35::TypeFinalizing::TypeFinalizing(this,true);
  return &this->super_Pass;
}

Assistant:

Pass* createTypeFinalizingPass() { return new TypeFinalizing(true); }